

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterDenseCoDim
          (SPxDevexPR<double> *this,double *best,double feastol,int start,int incr)

{
  double dVar1;
  SPxSolverBase<double> *this_00;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  SPxId SVar5;
  DataKey DVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  this_00 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (this_00->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this_00->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this_00->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = 0xffffffffffffffff;
  for (uVar8 = (ulong)start; (long)uVar8 < (long)(int)((ulong)((long)pdVar4 - (long)pdVar3) >> 3);
      uVar8 = uVar8 + (long)incr) {
    dVar1 = pdVar2[uVar8];
    if (dVar1 < -feastol) {
      dVar9 = feastol;
      if (feastol <= pdVar3[uVar8]) {
        dVar9 = pdVar3[uVar8];
      }
      dVar9 = (dVar1 * dVar1) / dVar9;
      if (*best <= dVar9 && dVar9 != *best) {
        *best = dVar9;
        this->last = pdVar3[uVar8];
        uVar7 = uVar8 & 0xffffffff;
      }
    }
  }
  if (-1 < (int)uVar7) {
    SVar5 = SPxSolverBase<double>::id(this_00,(int)uVar7);
    return (SPxId)SVar5.super_DataKey;
  }
  DVar6.info = 0;
  DVar6.idx = -1;
  return (SPxId)DVar6;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseCoDim(R& best, R feastol, int start, int incr)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int end = this->thesolver->weights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->test().dim());

   for(; start < end; start += incr)
   {
      x = test[start];

      if(test[start] < -feastol)
      {
         x = devexpr::computePrice(x, pen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = pen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}